

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::Equal(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  char16 cVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  charcount_t cVar5;
  int iVar6;
  BOOL BVar7;
  char16 *pcVar8;
  undefined4 *puVar9;
  char16 *__s2;
  uint uVar10;
  
  if (aLeft == aRight) {
    if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    if ((((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) ||
       (bVar3 = DynamicObject::IsBaseDynamicObject(aLeft), bVar3)) {
      return 1;
    }
  }
  else {
    bVar3 = VarIs<Js::JavascriptString>(aLeft);
    if ((bVar3) && (bVar3 = VarIs<Js::JavascriptString>(aRight), bVar3)) {
      cVar4 = JavascriptString::GetLength((JavascriptString *)aLeft);
      cVar5 = JavascriptString::GetLength((JavascriptString *)aRight);
      uVar10 = 0;
      bVar3 = false;
      if (cVar4 == cVar5) {
        pcVar8 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aLeft);
        bVar3 = true;
        if ((pcVar8 != (char16 *)0x0) &&
           (pcVar8 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aRight),
           pcVar8 != (char16 *)0x0)) {
          cVar4 = JavascriptString::GetLength((JavascriptString *)aLeft);
          pcVar8 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aLeft);
          if (cVar4 == 1) {
            cVar1 = *pcVar8;
            pcVar8 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aRight);
            bVar3 = cVar1 == *pcVar8;
          }
          else {
            __s2 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aRight);
            cVar4 = JavascriptString::GetLength((JavascriptString *)aLeft);
            iVar6 = bcmp(pcVar8,__s2,(ulong)cVar4 * 2);
            bVar3 = iVar6 == 0;
          }
          uVar10 = (uint)bVar3;
          bVar3 = false;
        }
      }
      if (!bVar3) {
        return uVar10;
      }
    }
  }
  BVar7 = Equal_Full(aLeft,aRight,scriptContext);
  return BVar7;
}

Assistant:

BOOL JavascriptOperators::Equal(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_Equal);
        JIT_HELPER_SAME_ATTRIBUTES(Op_Equal, Op_Equal_Full);
        if (aLeft == aRight)
        {
            if (TaggedInt::Is(aLeft) || DynamicObject::IsBaseDynamicObject(aLeft))
            {
                return true;
            }
            else
            {
                return Equal_Full(aLeft, aRight, scriptContext);
            }
        }

        if (VarIs<JavascriptString>(aLeft) && VarIs<JavascriptString>(aRight))
        {
            JavascriptString* left = (JavascriptString*)aLeft;
            JavascriptString* right = (JavascriptString*)aRight;

            if (left->GetLength() == right->GetLength())
            {
                if (left->UnsafeGetBuffer() != NULL && right->UnsafeGetBuffer() != NULL)
                {
                    if (left->GetLength() == 1)
                    {
                        return left->UnsafeGetBuffer()[0] == right->UnsafeGetBuffer()[0];
                    }
                    return memcmp(left->UnsafeGetBuffer(), right->UnsafeGetBuffer(), left->GetLength() * sizeof(left->UnsafeGetBuffer()[0])) == 0;
                }
                // fall through to Equal_Full
            }
            else
            {
                return false;
            }
        }

        return Equal_Full(aLeft, aRight, scriptContext);
        JIT_HELPER_END(Op_Equal);
    }